

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O0

uint8_t * cbor_text_skip(uint8_t *in,uint8_t *in_max,int64_t val,int *err)

{
  byte bVar1;
  long lStack_30;
  int cbor_class;
  int64_t val_1;
  int *err_local;
  int64_t val_local;
  uint8_t *in_max_local;
  uint8_t *in_local;
  
  in_max_local = in;
  if (val == -1) {
    err_local = (int *)0xffffffffffffffff;
    val_1 = (int64_t)err;
    val_local = (int64_t)in_max;
    while (in_max_local < (ulong)val_local && in_max_local != (uint8_t *)0x0) {
      if (*in_max_local == 0xff) {
        return in_max_local + 1;
      }
      bVar1 = *in_max_local;
      in_max_local = cbor_get_number(in_max_local,(uint8_t *)val_local,&stack0xffffffffffffffd0);
      if (in_max_local == (uint8_t *)0x0) {
        *(int *)val_1 = (int)lStack_30;
      }
      else if (((lStack_30 < 0) || ((ulong)val_local < in_max_local + lStack_30)) ||
              ((int)(uint)bVar1 >> 5 != 3)) {
        *(undefined4 *)val_1 = 0xfffffffd;
        in_max_local = (uint8_t *)0x0;
      }
      else if (0 < lStack_30) {
        in_max_local = in_max_local + lStack_30;
      }
    }
  }
  else if ((val < 0) || (in_max < in + val)) {
    *err = -3;
    in_max_local = (uint8_t *)0x0;
  }
  else if (0 < val) {
    in_max_local = in + val;
  }
  return in_max_local;
}

Assistant:

uint8_t* cbor_text_skip(uint8_t* in, uint8_t const* in_max, int64_t val, int* err)
{
    if (val == CBOR_END_OF_ARRAY) {
        while (in < in_max && in != NULL) {
            if (*in == CBOR_END_MARK) {
                in++;
                break;
            }
            else {
                int64_t val;
                int cbor_class = CBOR_CLASS(*in);

                in = cbor_get_number(in, in_max, &val);

                if (in == NULL) {
                    *err = (int)val;
                }
                else if (val < 0 || in + val > in_max || cbor_class != CBOR_T_TEXT) {
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else if (val > 0) {
                    in += val;
                }
            }
        }
    }
    else {
        if (val < 0 || in + val > in_max) {
            *err = CBOR_MALFORMED_VALUE;
            in = NULL;
        }
        else if (val > 0) {
            in += val;
        }
    }
    return in;
}